

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  undefined8 uVar1;
  istream *piVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  _Node *p_Var6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long_long *puVar11;
  long lVar12;
  mapped_type mVar13;
  ulong uVar14;
  bool bVar15;
  string local_108;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nums;
  unsigned_long_long L;
  unsigned_long_long S1;
  unsigned_long_long S2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  r;
  unsigned_long_long H;
  string operation;
  string n1;
  string n2;
  
  piVar2 = std::istream::_M_extract<unsigned_long_long>(&std::cin);
  std::istream::_M_extract<unsigned_long_long>((ulonglong *)piVar2);
  std::istream::ignore();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,0x14,(allocator_type *)(operation.field_2._M_local_buf + 8));
  if (r.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    uVar9 = 0;
    do {
      operation.field_2._8_8_ = &n1._M_string_length;
      n1._M_dataplus._M_p = (pointer)0x0;
      n1._M_string_length._0_1_ = 0;
      std::operator>>((istream *)&std::cin,(string *)(operation.field_2._M_local_buf + 8));
      std::istream::ignore();
      n2.field_2._8_8_ = uVar9;
      if ((pointer)((long)nums.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x14) !=
          n1._M_dataplus._M_p) {
        __assert_fail("L*20 == nl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/mayan.calculation/main.cpp"
                      ,0x2c,"int main()");
      }
      lVar8 = 0;
      lVar12 = 0;
      do {
        std::__cxx11::string::substr
                  ((ulong)((long)&n1.field_2 + 8),(ulong)(operation.field_2._M_local_buf + 8));
        std::__cxx11::string::_M_append
                  ((char *)((long)&((_Alloc_hider *)local_e8)->_M_p + lVar8),n1.field_2._8_8_);
        if ((size_type *)n1.field_2._8_8_ != &n2._M_string_length) {
          operator_delete((void *)n1.field_2._8_8_,
                          CONCAT71(n2._M_string_length._1_7_,(undefined1)n2._M_string_length) + 1);
        }
        uVar1 = n2.field_2._8_8_;
        lVar12 = lVar12 + 1;
        lVar8 = lVar8 + 0x20;
      } while (lVar12 != 0x14);
      if ((size_type *)operation.field_2._8_8_ != &n1._M_string_length) {
        operator_delete((void *)operation.field_2._8_8_,
                        CONCAT71(n1._M_string_length._1_7_,(undefined1)n1._M_string_length) + 1);
      }
      uVar9 = uVar1 + 1;
    } while (uVar9 < r.
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node._M_size);
  }
  lVar8 = 0;
  mVar13 = 0;
  do {
    *(undefined8 *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) = 2;
    poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)((long)&((_Alloc_hider *)local_e8)->_M_p + lVar8),
                        *(long *)((long)((long)local_e8 + 8) + lVar8));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
             ::operator[](&numbers_abi_cxx11_,
                          (key_type *)((long)&((_Alloc_hider *)local_e8)->_M_p + lVar8));
    *pmVar4 = mVar13;
    mVar13 = mVar13 + 1;
    lVar8 = lVar8 + 0x20;
  } while (mVar13 != 0x14);
  operation.field_2._8_8_ = &n1._M_string_length;
  n1._M_dataplus._M_p = (pointer)0x0;
  n1._M_string_length._0_1_ = 0;
  std::istream::_M_extract<unsigned_long_long>(&std::cin);
  std::istream::ignore();
  if (L == 0) {
    uVar9 = 0;
    n2.field_2._8_8_ = 0;
  }
  else {
    n2.field_2._8_8_ = 0;
    uVar14 = 0;
    uVar9 = 0;
    do {
      n1.field_2._8_8_ = &n2._M_string_length;
      n2._M_dataplus._M_p = (pointer)0x0;
      n2._M_string_length._0_1_ = 0;
      std::operator>>((istream *)&std::cin,(string *)(n1.field_2._M_local_buf + 8));
      std::istream::ignore();
      std::__cxx11::string::_M_append(operation.field_2._M_local_buf + 8,n1.field_2._8_8_);
      bVar15 = true;
      if (uVar14 % r.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size + 1 ==
          r.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size) {
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                ::find(&numbers_abi_cxx11_._M_t,(key_type *)((long)&operation.field_2 + 8));
        if ((_Rb_tree_header *)iVar5._M_node ==
            &numbers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown number ",0xf);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)operation.field_2._8_8_,
                              (long)n1._M_dataplus._M_p);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          n2.field_2._8_8_ = 0xffffffff;
          bVar15 = false;
        }
        else {
          uVar9 = uVar9 * 0x14 + *(long *)(iVar5._M_node + 2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"IR: ",4);
          poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::__cxx11::string::_M_replace
                    ((ulong)((long)&operation.field_2 + 8),0,n1._M_dataplus._M_p,0x1050f2);
        }
      }
      if ((size_type *)n1.field_2._8_8_ != &n2._M_string_length) {
        operator_delete((void *)n1.field_2._8_8_,
                        CONCAT71(n2._M_string_length._1_7_,(undefined1)n2._M_string_length) + 1);
      }
      if (!bVar15) {
        iVar7 = (int)n2.field_2._8_8_;
        goto LAB_00103d61;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < L);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"First number is ",0x10);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  n1.field_2._8_8_ = &n2._M_string_length;
  n2._M_dataplus._M_p = (pointer)0x0;
  n2._M_string_length._0_1_ = 0;
  std::istream::_M_extract<unsigned_long_long>(&std::cin);
  std::istream::ignore();
  if (S1 == 0) {
    uVar14 = 0;
  }
  else {
    uVar10 = 0;
    uVar14 = 0;
    do {
      H = (unsigned_long_long)&operation._M_string_length;
      operation._M_dataplus._M_p = (pointer)0x0;
      operation._M_string_length._0_1_ = 0;
      std::operator>>((istream *)&std::cin,(string *)&H);
      std::istream::ignore();
      std::__cxx11::string::_M_append(n1.field_2._M_local_buf + 8,H);
      bVar15 = true;
      if (uVar10 % r.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size + 1 ==
          r.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size) {
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                ::find(&numbers_abi_cxx11_._M_t,(key_type *)((long)&n1.field_2 + 8));
        bVar15 = (_Rb_tree_header *)iVar5._M_node ==
                 &numbers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
        if (bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown number ",0xf);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)n1.field_2._8_8_,
                              (long)n2._M_dataplus._M_p);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          n2.field_2._8_8_ = 0xffffffff;
        }
        else {
          lVar8 = *(long *)(iVar5._M_node + 2);
          std::__cxx11::string::_M_replace
                    ((ulong)((long)&n1.field_2 + 8),0,n2._M_dataplus._M_p,0x1050f2);
          uVar14 = lVar8 + uVar14 * 0x14;
        }
        bVar15 = !bVar15;
      }
      if ((size_type *)H != &operation._M_string_length) {
        operator_delete((void *)H,
                        CONCAT71(operation._M_string_length._1_7_,
                                 (undefined1)operation._M_string_length) + 1);
      }
      if (!bVar15) {
        iVar7 = (int)n2.field_2._8_8_;
        goto LAB_00103d4c;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < S1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Second number is ",0x11)
  ;
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  H = (unsigned_long_long)&operation._M_string_length;
  operation._M_dataplus._M_p = (pointer)0x0;
  operation._M_string_length._0_1_ = 0;
  std::operator>>((istream *)&std::cin,(string *)&H);
  std::istream::ignore();
  switch(*(undefined1 *)H) {
  case 0x2a:
    uVar9 = uVar14 * uVar9;
    break;
  case 0x2b:
    uVar9 = uVar14 + uVar9;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unknown operation",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    iVar7 = -3;
    std::ostream::flush();
    goto LAB_00103d30;
  case 0x2d:
    uVar9 = uVar9 - uVar14;
    break;
  case 0x2f:
    uVar9 = uVar9 / uVar14;
  }
  S2 = (unsigned_long_long)&S2;
  r.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  r.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)S2;
  do {
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
    p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string_const&>
                       ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&S2,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)local_e8 + (uVar9 % 0x14) * 0x20));
    std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
    r.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)
         ((long)&(r.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
    bVar15 = 0x13 < uVar9;
    uVar9 = uVar9 / 0x14;
  } while (bVar15);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((unsigned_long_long *)S2 != &S2) {
    puVar11 = (unsigned_long_long *)S2;
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)puVar11[2],puVar11[3]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,puVar11[2],puVar11[3] + puVar11[2]);
      print_number(&local_108,
                   r.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      puVar11 = (unsigned_long_long *)*puVar11;
    } while (puVar11 != &S2);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&S2);
  iVar7 = (int)n2.field_2._8_8_;
LAB_00103d30:
  if ((size_type *)H != &operation._M_string_length) {
    operator_delete((void *)H,
                    CONCAT71(operation._M_string_length._1_7_,(undefined1)operation._M_string_length
                            ) + 1);
  }
LAB_00103d4c:
  if ((size_type *)n1.field_2._8_8_ != &n2._M_string_length) {
    operator_delete((void *)n1.field_2._8_8_,
                    CONCAT71(n2._M_string_length._1_7_,(undefined1)n2._M_string_length) + 1);
  }
LAB_00103d61:
  if ((size_type *)operation.field_2._8_8_ != &n1._M_string_length) {
    operator_delete((void *)operation.field_2._8_8_,
                    CONCAT71(n1._M_string_length._1_7_,(undefined1)n1._M_string_length) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e8);
  return iVar7;
}

Assistant:

int main()
{
    unsigned long long int L;
    unsigned long long int H;
    cin >> L >> H;
    cin.ignore();
    
    std::vector<std::string> nums(20);
    for (unsigned long long int i = 0; i < H; i++)
    {
        string numeral;
        cin >> numeral;
        cin.ignore();
        
        const size_t nl = numeral.length();
        assert(L*20 == nl);
        for (size_t i = 0; i < 20; i++)
        {
            nums[i] += numeral.substr(L*i, L);
        }
    }
    
    for (unsigned long long int i = 0; i < 20; i++)
    {
        cerr.width(2);
        cerr << i << ": " << nums[i] << endl;
        numbers[nums[i]] = i;
    }
    
    unsigned long long int S1;
    unsigned long long int N1 = 0;
    std::string n1;
    cin >> S1;
    cin.ignore();
    for (unsigned long long int i = 0; i < S1; i++)
    {
        string num1Line;
        cin >> num1Line;
        cin.ignore();
        n1 += num1Line;
        if (1 + i % H == H)
        {
            std::map<std::string, unsigned long long int>::const_iterator ni1 = numbers.find(n1);
            if (numbers.end() == ni1)
            {
                cerr << "Unknown number " << n1 << endl;
                return -1;
            }
            N1 = 20*N1 + ni1->second;
            cerr << "IR: " << N1 << endl;
            n1 = "";
        }
    }
    cerr << "First number is " << N1 << endl;
    
    unsigned long long int S2;
    unsigned long long int N2 = 0;
    std::string n2;
    cin >> S2;
    cin.ignore();
    for (unsigned long long int i = 0; i < S2; i++)
    {
        string num2Line;
        cin >> num2Line;
        cin.ignore();
        n2 += num2Line;
        if (1 + i % H == H)
        {
            std::map<std::string, unsigned long long int>::const_iterator ni2 = numbers.find(n2);
            if (numbers.end() == ni2)
            {
                cerr << "Unknown number " << n2 << endl;
                return -1;
            }
            N2 = 20*N2 + ni2->second;
            n2 = "";
        }
    }
    cerr << "Second number is " << N2 << endl;
    
    string operation;
    cin >> operation;
    cin.ignore();
    
    unsigned long long int result;
    switch (operation[0])
    {
        case '+':
            result = N1 + N2;
            break;
            
        case '-':
            result = N1 - N2;
            break;
            
        case '*':
            result = N1*N2;
            break;
            
        case '/':
            result = N1/N2;
            break;
            
        default:
            cerr << "Unknown operation" << endl;
            return -3;
    }
    
    std::list<std::string> r;
    do
    {
        cerr << result % 20;
        r.push_front(nums[result % 20]);
        result /= 20;
    } while (0 < result);
    cerr << endl;
    
    for (std::list<std::string>::const_iterator i = r.begin(); i != r.end(); i++)
    {
        cerr << *i << endl;
        print_number(*i, H);
    }
}